

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::AddInteractionBPM_duplicate_value_2_Test::TestBody
          (AddInteractionBPM_duplicate_value_2_Test *this)

{
  __node_base *p_Var1;
  double local_198;
  Polynomial<uint32_t,_double> polynomial;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  
  GeneratePolynomialUINT();
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel(&bpm,&polynomial,SPIN);
  p_Var1 = &polynomial._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    local_198 = -(double)p_Var1[4]._M_nxt;
    cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteraction
              (&bpm,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var1 + 1),&local_198,
               NONE);
  }
  StateTestBPMEmpty<unsigned_int>(&bpm);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::~BinaryPolynomialModel(&bpm);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&polynomial._M_h);
  return;
}

Assistant:

TEST(AddInteractionBPM, duplicate_value_2) {
   
   Polynomial<uint32_t, double> polynomial = GeneratePolynomialUINT();
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   for (const auto &it: polynomial) {
      bpm.AddInteraction(it.first, -it.second);
   };
   
   StateTestBPMEmpty(bpm);
}